

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConic,_1UL>::Construct
                   (DB *db,LIST *params)

{
  DB *in;
  DB *db_00;
  
  in = (DB *)operator_new(0x68);
  (in->header).fileSchema.field_2._M_allocated_capacity = (size_type)&PTR__Object_00806a70;
  *(undefined8 *)((long)&(in->header).fileSchema.field_2 + 8) = 0;
  *(char **)&(in->objects)._M_t._M_impl = "IfcConic";
  db_00 = in;
  Assimp::IFC::Schema_2x3::IfcCurve::IfcCurve((IfcCurve *)in,&PTR_construction_vtable_24__0084b1c0);
  *(undefined8 *)((long)&(in->header).app.field_2 + 8) = 0;
  (((IfcGeometricRepresentationItem *)&(in->header).timestamp)->super_IfcRepresentationItem).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcConic_0084b108;
  (in->header).fileSchema.field_2._M_allocated_capacity = (size_type)&PTR__IfcConic_0084b1a8;
  *(undefined ***)
   &(((IfcGeometricRepresentationItem *)&(in->header).timestamp)->super_IfcRepresentationItem).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcConic_0084b130;
  (in->header).app._M_dataplus._M_p = (pointer)&PTR__IfcConic_0084b158;
  (in->header).app.field_2._M_allocated_capacity = (size_type)&PTR__IfcConic_0084b180;
  (in->header).fileSchema._M_dataplus._M_p = (pointer)0x0;
  (in->header).fileSchema._M_string_length = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcConic>(db_00,params,(IfcConic *)in);
  return (Object *)
         ((long)&(((IfcGeometricRepresentationItem *)&(in->header).timestamp)->
                 super_IfcRepresentationItem).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(((IfcGeometricRepresentationItem *)&(in->header).timestamp)->
               super_IfcRepresentationItem).
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }